

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

bool __thiscall csv::CSVField::try_parse_decimal(CSVField *this,longdouble *dVal,char decimalSymbol)

{
  DataType DVar1;
  char decimalSymbol_local;
  longdouble *dVal_local;
  CSVField *this_local;
  
  if (this->_type == CSV_NULL) {
    this_local._7_1_ = false;
  }
  else {
    if (((this->_type == UNKNOWN) || (this->_type == CSV_STRING)) || (this->_type == CSV_DOUBLE)) {
      DVar1 = internals::data_type(this->sv,&this->value,decimalSymbol);
      this->_type = DVar1;
    }
    if ((this->_type < CSV_INT8) || (CSV_DOUBLE < this->_type)) {
      this_local._7_1_ = false;
    }
    else {
      *dVal = this->value;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

CSV_INLINE bool CSVField::try_parse_decimal(long double& dVal, const char decimalSymbol) {
        // If field has already been parsed to empty, no need to do it aagin:
        if (this->_type == DataType::CSV_NULL)
                    return false;

        // Not yet parsed or possibly parsed with other decimalSymbol
        if (this->_type == DataType::UNKNOWN || this->_type == DataType::CSV_STRING || this->_type == DataType::CSV_DOUBLE)
            this->_type = internals::data_type(this->sv, &this->value, decimalSymbol); // parse again

        // Integral types are not affected by decimalSymbol and need not be parsed again

        // Either we already had an integral type before, or we we just got any numeric type now.
        if (this->_type >= DataType::CSV_INT8 && this->_type <= DataType::CSV_DOUBLE) {
            dVal = this->value;
            return true;
        }

        // CSV_NULL or CSV_STRING, not numeric
        return false;
    }